

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O0

int parseHexString(string *hex,uchar *dest)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  size_t index;
  int value;
  int source;
  size_t i;
  uchar *dest_local;
  string *hex_local;
  
  _value = 0;
  do {
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= _value) {
      iVar1 = std::__cxx11::string::size();
      return iVar1 / 2;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)hex);
    iVar1 = tolower((int)*pcVar3);
    if ((iVar1 < 0x61) || (0x66 < iVar1)) {
      if ((iVar1 < 0x30) || (0x39 < iVar1)) {
        return -1;
      }
      index._0_1_ = (char)iVar1 - 0x30;
    }
    else {
      index._0_1_ = (char)iVar1 + 0xa9;
    }
    uVar2 = _value >> 1;
    if ((_value & 1) == 0) {
      dest[uVar2] = (byte)index;
    }
    else {
      dest[uVar2] = dest[uVar2] << 4 | (byte)index;
    }
    _value = _value + 1;
  } while( true );
}

Assistant:

int parseHexString(std::string& hex, unsigned char* dest)
{
	for (size_t i = 0; i < hex.size(); i++)
	{
		int source = tolower(hex[i]);
		int value;

		if (source >= 'a' && source <= 'f')
		{
			value = source-'a'+10;
		} else if (source >= '0' && source <= '9')
		{
			value = source-'0';
		} else {
			return -1;
		}

		size_t index = i/2;
		if (i % 2)
			dest[index] = (dest[index] << 4) | value;
		else
			dest[index] = value;
	}

	return (int) hex.size()/2;
}